

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_renderer.c
# Opt level: O2

GPU_Renderer * GPU_CreateRenderer(GPU_RendererID id)

{
  long lVar1;
  GPU_RendererEnum GVar2;
  code *pcVar3;
  GPU_Renderer *pGVar4;
  long lVar5;
  
  lVar1 = -0x28;
  do {
    lVar5 = lVar1;
    lVar1 = lVar5 + 0x28;
    if (lVar1 == 400) goto LAB_0013995b;
    GVar2 = *(GPU_RendererEnum *)((long)&_gpu_renderer_register[1].id.renderer + lVar5);
  } while ((GVar2 == 0) || (id.renderer != GVar2));
  pcVar3 = *(code **)((long)&_gpu_renderer_register[1].createFn + lVar5);
  if ((pcVar3 != (code *)0x0) &&
     (pGVar4 = (GPU_Renderer *)(*pcVar3)(), pGVar4 != (GPU_Renderer *)0x0)) {
    return pGVar4;
  }
LAB_0013995b:
  GPU_PushErrorCode("GPU_CreateRenderer",GPU_ERROR_DATA_ERROR,
                    "Renderer was not found in the renderer registry.");
  return (GPU_Renderer *)0x0;
}

Assistant:

GPU_Renderer* GPU_CreateRenderer(GPU_RendererID id)
{
	GPU_Renderer* result = NULL;
	int i;
	for(i = 0; i < GPU_MAX_REGISTERED_RENDERERS; i++)
	{
		if(_gpu_renderer_register[i].id.renderer == GPU_RENDERER_UNKNOWN)
			continue;
		
		if(id.renderer == _gpu_renderer_register[i].id.renderer)
		{
			if(_gpu_renderer_register[i].createFn != NULL)
            {
                // Use the registered name
                id.name = _gpu_renderer_register[i].id.name;
				result = _gpu_renderer_register[i].createFn(id);
            }
			break;
		}
	}
	
	if(result == NULL)
    {
        GPU_PushErrorCode(__func__, GPU_ERROR_DATA_ERROR, "Renderer was not found in the renderer registry.");
    }
	return result;
}